

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldLiteGenerator::GenerateInterfaceMembers
          (ImmutableStringFieldLiteGenerator *this,Printer *printer)

{
  FieldDescriptor *this_00;
  long lVar1;
  Descriptor *pDVar2;
  
  this_00 = this->descriptor_;
  if (((~(byte)this_00[1] & 0x60) != 0) &&
     ((((pDVar2 = FieldDescriptor::message_type(this_00), pDVar2 != (Descriptor *)0x0 ||
        (((byte)this_00[1] & 2) != 0)) || (*(char *)(*(long *)(this_00 + 0x10) + 0x3a) == '\x02'))
      || ((lVar1 = *(long *)(this_00 + 0x28), lVar1 != 0 && ((byte)this_00[1] & 0x10) != 0 &&
          ((*(int *)(lVar1 + 4) != 1 || ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) == 0)))))))) {
    WriteFieldAccessorDocComment(printer,this->descriptor_,HAZZER,false);
    io::Printer::Print(printer,&this->variables_,"$deprecation$boolean has$capitalized_name$();\n");
  }
  WriteFieldAccessorDocComment(printer,this->descriptor_,GETTER,false);
  io::Printer::Print(printer,&this->variables_,
                     "$deprecation$java.lang.String get$capitalized_name$();\n");
  WriteFieldStringBytesAccessorDocComment(printer,this->descriptor_,GETTER,false);
  io::Printer::Print(printer,&this->variables_,
                     "$deprecation$com.google.protobuf.ByteString\n    get$capitalized_name$Bytes();\n"
                    );
  return;
}

Assistant:

void ImmutableStringFieldLiteGenerator::GenerateInterfaceMembers(
    io::Printer* printer) const {
  if (HasHazzer(descriptor_)) {
    WriteFieldAccessorDocComment(printer, descriptor_, HAZZER);
    printer->Print(variables_,
                   "$deprecation$boolean has$capitalized_name$();\n");
  }
  WriteFieldAccessorDocComment(printer, descriptor_, GETTER);
  printer->Print(variables_,
                 "$deprecation$java.lang.String get$capitalized_name$();\n");
  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, GETTER);
  printer->Print(variables_,
                 "$deprecation$com.google.protobuf.ByteString\n"
                 "    get$capitalized_name$Bytes();\n");
}